

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O0

void cjson_get_string_value_should_get_a_string(void)

{
  cJSON *item;
  cJSON *item_00;
  char *pcVar1;
  cJSON *number;
  cJSON *string;
  
  item = cJSON_CreateString("test");
  item_00 = cJSON_CreateNumber(1.0);
  pcVar1 = cJSON_GetStringValue(item);
  if (pcVar1 != item->valuestring) {
    UnityFail(" Expected TRUE Was FALSE",0x22a);
  }
  pcVar1 = cJSON_GetStringValue(item_00);
  if (pcVar1 != (char *)0x0) {
    UnityFail(" Expected NULL",0x22b);
  }
  pcVar1 = cJSON_GetStringValue((cJSON *)0x0);
  if (pcVar1 != (char *)0x0) {
    UnityFail(" Expected NULL",0x22c);
  }
  cJSON_Delete(item_00);
  cJSON_Delete(item);
  return;
}

Assistant:

static void cjson_get_string_value_should_get_a_string(void)
{
    cJSON *string = cJSON_CreateString("test");
    cJSON *number = cJSON_CreateNumber(1);

    TEST_ASSERT_TRUE(cJSON_GetStringValue(string) == string->valuestring);
    TEST_ASSERT_NULL(cJSON_GetStringValue(number));
    TEST_ASSERT_NULL(cJSON_GetStringValue(NULL));

    cJSON_Delete(number);
    cJSON_Delete(string);
}